

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v9::basic_printf_context<fmt::v9::appender,_char>,_char[4608]> * __thiscall
fmt::v9::make_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,char>,char_const(&)[4608]>
          (format_arg_store<fmt::v9::basic_printf_context<fmt::v9::appender,_char>,_char[4608]>
           *__return_storage_ptr__,v9 *this,char (*args) [4608])

{
  char (*args_local) [4608];
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  char_type **arg;
  
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {FMT_FORWARD(args)...};
}